

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_rowcol
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int *local_120;
  int local_118;
  int NWL;
  int NWS;
  int NWM;
  int NWH;
  int F_ext;
  int F_opn;
  int E_ext;
  int E_opn;
  int H_dag;
  int EL;
  int ES;
  int EM;
  int E;
  int WHL;
  int WHS;
  int WHM;
  int WH;
  int NHL;
  int NHS;
  int NHM;
  int NH;
  int *matrow;
  int local_b0;
  int end_ref;
  int end_query;
  int length;
  int similar;
  int matches;
  int score;
  int s1Len;
  int j;
  int i;
  int *FL;
  int *FS;
  int *FM;
  int *F;
  int *HL;
  int *HS;
  int *HM;
  int *H;
  int *s2;
  int *s1;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_rowcol","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_rowcol","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_rowcol","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_rowcol","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_rowcol","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_sw_stats_rowcol");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_rowcol","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_rowcol","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_118 = _s1Len;
    if (matrix->type != 0) {
      local_118 = matrix->length;
    }
    similar = -0x40000000;
    length = -0x40000000;
    end_query = -0x40000000;
    end_ref = -0x40000000;
    local_b0 = local_118;
    _s1_local = (char *)parasail_result_new_rowcol3(local_118,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x1410104;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40000;
      ptr = parasail_memalign_int(0x10,(long)local_118);
      ptr_00 = parasail_memalign_int(0x10,(long)s2Len);
      ptr_01 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      ptr_02 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      ptr_03 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      ptr_04 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      ptr_05 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      ptr_06 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      ptr_07 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      ptr_08 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      if (ptr == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_02 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_03 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_04 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_05 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_06 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_07 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_08 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        for (s1Len = 0; s1Len < local_118; s1Len = s1Len + 1) {
          ptr[s1Len] = matrix->mapper[(byte)_s1[s1Len]];
        }
        for (score = 0; score < s2Len; score = score + 1) {
          ptr_00[score] = matrix->mapper[(byte)_s2[score]];
        }
        *ptr_01 = 0;
        *ptr_02 = 0;
        *ptr_03 = 0;
        *ptr_04 = 0;
        *ptr_05 = -0x40000000;
        *ptr_06 = 0;
        *ptr_07 = 0;
        *ptr_08 = 0;
        for (score = 1; score <= s2Len; score = score + 1) {
          ptr_01[score] = 0;
          ptr_02[score] = 0;
          ptr_03[score] = 0;
          ptr_04[score] = 0;
          ptr_05[score] = -0x40000000;
          ptr_06[score] = 0;
          ptr_07[score] = 0;
          ptr_08[score] = 0;
        }
        matrow._4_4_ = s2Len;
        for (s1Len = 1; s1Len <= local_118; s1Len = s1Len + 1) {
          if (matrix->type == 0) {
            local_120 = matrix->matrix + matrix->size * ptr[s1Len + -1];
          }
          else {
            local_120 = matrix->matrix + matrix->size * (s1Len + -1);
          }
          NHS = *ptr_01;
          NHL = *ptr_02;
          WH = *ptr_03;
          WHM = *ptr_04;
          WHS = 0;
          WHL = 0;
          E = 0;
          EM = 0;
          ES = -0x40000000;
          EL = 0;
          H_dag = 0;
          E_opn = 0;
          *ptr_01 = 0;
          *ptr_02 = 0;
          *ptr_03 = 0;
          *ptr_04 = 0;
          for (score = 1; score <= s2Len; score = score + 1) {
            iVar1 = ptr_01[score];
            iVar2 = ptr_02[score];
            iVar3 = ptr_03[score];
            iVar4 = ptr_04[score];
            iVar5 = iVar1 - open;
            iVar6 = ptr_05[score] - gap;
            local_124 = iVar6;
            if (iVar6 < iVar5) {
              local_124 = iVar5;
            }
            ptr_05[score] = local_124;
            iVar7 = WHS - open;
            iVar8 = ES - gap;
            local_128 = iVar8;
            if (iVar8 < iVar7) {
              local_128 = iVar7;
            }
            ES = local_128;
            iVar9 = NHS + local_120[ptr_00[score + -1]];
            local_12c = iVar9;
            if (iVar9 < 1) {
              local_12c = 0;
            }
            if (local_128 < local_12c) {
              local_130 = local_12c;
            }
            else {
              local_130 = local_128;
            }
            if (ptr_05[score] < local_130) {
              local_134 = local_130;
            }
            else {
              local_134 = ptr_05[score];
            }
            WHS = local_134;
            if (iVar6 < iVar5) {
              ptr_06[score] = iVar2;
              ptr_07[score] = iVar3;
              ptr_08[score] = iVar4;
            }
            ptr_08[score] = ptr_08[score] + 1;
            if (iVar8 < iVar7) {
              EL = WHL;
              H_dag = E;
              E_opn = EM;
            }
            E_opn = E_opn + 1;
            if (local_134 == iVar9) {
              WHL = NHL + (uint)(ptr[s1Len + -1] == ptr_00[score + -1]);
              E = WH + (uint)(0 < local_120[ptr_00[score + -1]]);
              EM = WHM + 1;
            }
            else if (local_134 == ptr_05[score]) {
              WHL = ptr_06[score];
              E = ptr_07[score];
              EM = ptr_08[score];
            }
            else {
              WHL = EL;
              E = H_dag;
              EM = E_opn;
            }
            if (local_134 < 1) {
              WHS = 0;
              WHL = 0;
              E = 0;
              EM = 0;
            }
            ptr_01[score] = WHS;
            ptr_02[score] = WHL;
            ptr_03[score] = E;
            ptr_04[score] = EM;
            if (similar < WHS) {
              similar = WHS;
              length = WHL;
              end_query = E;
              end_ref = EM;
              local_b0 = s1Len + -1;
              matrow._4_4_ = score + -1;
            }
            else if ((similar == WHS) && (score + -1 < matrow._4_4_)) {
              length = WHL;
              end_query = E;
              end_ref = EM;
              local_b0 = s1Len + -1;
              matrow._4_4_ = score + -1;
            }
            WHM = iVar4;
            WH = iVar3;
            NHL = iVar2;
            NHS = iVar1;
          }
          *(int *)(*(long *)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                   trace_del_table + 0x20) + (long)(s1Len + -1) * 4) = WHS;
          *(int *)(*(long *)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                   trace_del_table + 0x28) + (long)(s1Len + -1) * 4) = WHL;
          *(int *)(*(long *)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                   trace_del_table + 0x30) + (long)(s1Len + -1) * 4) = E;
          *(int *)(*(long *)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                   trace_del_table + 0x38) + (long)(s1Len + -1) * 4) = EM;
        }
        for (score = 1; score <= s2Len; score = score + 1) {
          *(int *)(*((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table +
                  (long)(score + -1) * 4) = ptr_01[score];
          *(int *)(*(long *)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                   trace_del_table + 8) + (long)(score + -1) * 4) = ptr_02[score];
          *(int *)(*(long *)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                   trace_del_table + 0x10) + (long)(score + -1) * 4) = ptr_03[score]
          ;
          *(int *)(*(long *)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                   trace_del_table + 0x18) + (long)(score + -1) * 4) = ptr_04[score]
          ;
        }
        ((parasail_result_t *)_s1_local)->score = similar;
        ((parasail_result_t *)_s1_local)->end_query = local_b0;
        ((parasail_result_t *)_s1_local)->end_ref = matrow._4_4_;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->matches = length;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->similar = end_query;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->length = end_ref;
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = NEG_INF_32;
    similar = NEG_INF_32;
    length = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H  = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F  = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = 0;
        HM[j] = 0;
        HS[j] = 0;
        HL[j] = 0;
        F[j] = NEG_INF_32;
        FM[j] = 0;
        FS[j] = 0;
        FL[j] = 0;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = 0;
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext  = F[j] - gap;
            F[j]  = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, 0);
            WH = MAX(WH, E);
            WH = MAX(WH, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            if (WH == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (WH == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            if (WH <= 0) {
                WH = 0;
                WHM = 0;
                WHS = 0;
                WHL = 0;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
            if (WH > score) {
                score = WH;
                matches = WHM;
                similar = WHS;
                length = WHL;
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == WH && j-1 < end_ref) {
                matches = WHM;
                similar = WHS;
                length = WHL;
                end_query = i-1;
                end_ref = j-1;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}